

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraCodeBlocksGenerator::CreateNewProjectFile
          (cmExtraCodeBlocksGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,string *filename)

{
  cmMakefile *pcVar1;
  cmGeneratorTarget *pcVar2;
  cmSourceFile *this_00;
  bool bVar3;
  __type _Var4;
  TargetType TVar5;
  int iVar6;
  cmGlobalGenerator *pcVar7;
  char *pcVar8;
  long lVar9;
  cmSystemTools *this_01;
  _Base_ptr p_Var10;
  ostream *poVar11;
  string *psVar12;
  char *__s2;
  mapped_type *pmVar13;
  iterator iVar14;
  mapped_type *this_02;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_RCX;
  pointer ppcVar15;
  pointer pbVar16;
  _Alloc_hider _Var17;
  pointer ppcVar18;
  pointer ppcVar19;
  _Base_ptr p_Var20;
  pointer pbVar21;
  allocator local_44a;
  allocator local_449;
  string compiler;
  all_files_map_t allFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headerExts;
  string unitFiles;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  string fastTarget;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cFiles;
  string make;
  string virtualFolders;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srcExts;
  Tree tree;
  cmGeneratedFileStream fout;
  
  pcVar1 = (*(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
             _M_impl.super__Vector_impl_data._M_start)->Makefile;
  cmGeneratedFileStream::cmGeneratedFileStream(&fout,(filename->_M_dataplus)._M_p,false);
  if (((&fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) == 0) {
    tree.path._M_dataplus._M_p = (pointer)&tree.path.field_2;
    tree.path._M_string_length = 0;
    tree.path.field_2._M_local_buf[0] = '\0';
    tree.folders.super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    tree.folders.super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    tree.folders.super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    tree.files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tree.files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    tree.files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar7 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    p_Var10 = (pcVar7->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((_Rb_tree_header *)p_Var10 != &(pcVar7->ProjectMap)._M_t._M_impl.super__Rb_tree_header) {
      unitFiles._M_dataplus._M_p = (pointer)0x0;
      unitFiles._M_string_length = 0;
      unitFiles.field_2._M_allocated_capacity = 0;
      for (p_Var20 = *(_Base_ptr *)(p_Var10 + 2); p_Var20 != p_Var10[2]._M_parent;
          p_Var20 = (_Base_ptr)&p_Var20->_M_parent) {
        in_RCX._M_current =
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              (*(long *)(*(long *)p_Var20 + 0x28) + 0x130);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&unitFiles,
                   (const_iterator)unitFiles._M_string_length,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (*(long *)(*(long *)p_Var20 + 0x28) + 0x128),in_RCX);
      }
      std::__cxx11::string::string((string *)&allFiles,"CMAKE_ROOT",(allocator *)&virtualFolders);
      pcVar8 = cmMakefile::GetDefinition(pcVar1,(string *)&allFiles);
      std::__cxx11::string::~string((string *)&allFiles);
      for (_Var17 = unitFiles._M_dataplus; _Var17._M_p != (pointer)unitFiles._M_string_length;
          _Var17._M_p = _Var17._M_p + 0x20) {
        lVar9 = std::__cxx11::string::find(_Var17._M_p,(ulong)pcVar8);
        if (lVar9 != 0) {
          this_01 = (cmSystemTools *)
                    cmLocalGenerator::GetSourceDirectory
                              ((cmLocalGenerator *)**(undefined8 **)(p_Var10 + 2));
          cmSystemTools::RelativePath_abi_cxx11_
                    ((string *)&allFiles,this_01,*(char **)_Var17._M_p,(char *)in_RCX._M_current);
          compiler._M_dataplus._M_p = (pointer)0x0;
          compiler._M_string_length = 0;
          compiler.field_2._M_allocated_capacity = 0;
          cmsys::SystemTools::SplitPath
                    ((string *)&allFiles,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&compiler,false);
          std::__cxx11::string::string
                    ((string *)&virtualFolders,(string *)(compiler._M_string_length - 0x20));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&compiler,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (compiler._M_string_length - 0x20),(const_iterator)compiler._M_string_length);
          if (((pointer)compiler._M_string_length != compiler._M_dataplus._M_p) &&
             (lVar9 = std::__cxx11::string::find((char *)&allFiles,0x53243a), lVar9 == -1)) {
            in_RCX._M_current = &virtualFolders;
            Tree::InsertPath(&tree,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&compiler,1,&virtualFolders);
          }
          std::__cxx11::string::~string((string *)&virtualFolders);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&compiler);
          std::__cxx11::string::~string((string *)&allFiles);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&unitFiles);
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
      pcVar7 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    }
    virtualFolders._M_dataplus._M_p = (pointer)&virtualFolders.field_2;
    virtualFolders._M_string_length = 0;
    virtualFolders.field_2._M_local_buf[0] = '\0';
    Tree::BuildVirtualFolder(&tree,&virtualFolders);
    unitFiles._M_dataplus._M_p = (pointer)&unitFiles.field_2;
    unitFiles._M_string_length = 0;
    unitFiles.field_2._M_allocated_capacity =
         unitFiles.field_2._M_allocated_capacity & 0xffffffffffffff00;
    pcVar8 = cmLocalGenerator::GetSourceDirectory
                       (*(lgs->
                         super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                         )._M_impl.super__Vector_impl_data._M_start);
    std::__cxx11::string::string((string *)&compiler,pcVar8,(allocator *)&make);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&allFiles,
                   &compiler,"/");
    Tree::BuildUnit(&tree,&unitFiles,(string *)&allFiles);
    std::__cxx11::string::~string((string *)&allFiles);
    std::__cxx11::string::~string((string *)&compiler);
    GetCBCompilerId_abi_cxx11_(&compiler,this,pcVar1);
    std::__cxx11::string::string((string *)&allFiles,"CMAKE_MAKE_PROGRAM",(allocator *)&fastTarget);
    pcVar8 = cmMakefile::GetRequiredDefinition(pcVar1,(string *)&allFiles);
    std::__cxx11::string::string((string *)&make,pcVar8,(allocator *)&targets);
    std::__cxx11::string::~string((string *)&allFiles);
    poVar11 = std::operator<<((ostream *)&fout,
                              "<?xml version=\"1.0\" encoding=\"UTF-8\" standalone=\"yes\" ?>\n<CodeBlocks_project_file>\n   <FileVersion major=\"1\" minor=\"6\" />\n   <Project>\n      <Option title=\""
                             );
    cmLocalGenerator::GetProjectName_abi_cxx11_
              ((string *)&allFiles,
               *(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                _M_impl.super__Vector_impl_data._M_start);
    poVar11 = std::operator<<(poVar11,(string *)&allFiles);
    poVar11 = std::operator<<(poVar11,
                              "\" />\n      <Option makefile_is_custom=\"1\" />\n      <Option compiler=\""
                             );
    poVar11 = std::operator<<(poVar11,(string *)&compiler);
    poVar11 = std::operator<<(poVar11,"\" />\n      ");
    poVar11 = std::operator<<(poVar11,(string *)&virtualFolders);
    std::operator<<(poVar11,"\n      <Build>\n");
    std::__cxx11::string::~string((string *)&allFiles);
    std::__cxx11::string::string((string *)&allFiles,"all",(allocator *)&fastTarget);
    AppendTarget(this,&fout,(string *)&allFiles,(cmGeneratorTarget *)0x0,make._M_dataplus._M_p,
                 *(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start,compiler._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&allFiles);
    for (ppcVar15 = (lgs->
                    super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                    _M_impl.super__Vector_impl_data._M_start;
        ppcVar15 !=
        (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
        super__Vector_impl_data._M_finish; ppcVar15 = ppcVar15 + 1) {
      std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
                (&targets,&(*ppcVar15)->GeneratorTargets);
      for (ppcVar19 = targets.
                      super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          ppcVar19 !=
          targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppcVar19 = ppcVar19 + 1) {
        psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar19);
        std::__cxx11::string::string((string *)&allFiles,(string *)psVar12);
        TVar5 = cmGeneratorTarget::GetType(*ppcVar19);
        if (TVar5 < UTILITY) {
          pcVar2 = *ppcVar19;
          AppendTarget(this,&fout,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &allFiles,pcVar2,make._M_dataplus._M_p,*ppcVar15,compiler._M_dataplus._M_p);
          std::__cxx11::string::string((string *)&fastTarget,(string *)&allFiles);
          std::__cxx11::string::append((char *)&fastTarget);
          AppendTarget(this,&fout,&fastTarget,pcVar2,make._M_dataplus._M_p,*ppcVar15,
                       compiler._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&fastTarget);
        }
        else if (TVar5 == UTILITY) {
          lVar9 = std::__cxx11::string::find((char *)&allFiles,0x52eef5);
          if ((((lVar9 != 0) ||
               (bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&allFiles,"Nightly"), !bVar3)) &&
              ((lVar9 = std::__cxx11::string::find((char *)&allFiles,0x52edf1), lVar9 != 0 ||
               (bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&allFiles,"Continuous"), !bVar3)))) &&
             ((lVar9 = std::__cxx11::string::find((char *)&allFiles,0x52ee70), lVar9 != 0 ||
              (bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&allFiles,"Experimental"), !bVar3)))) {
LAB_003fbcfe:
            AppendTarget(this,&fout,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &allFiles,(cmGeneratorTarget *)0x0,make._M_dataplus._M_p,*ppcVar15,
                         compiler._M_dataplus._M_p);
          }
        }
        else if (TVar5 == GLOBAL_TARGET) {
          pcVar8 = cmLocalGenerator::GetCurrentBinaryDirectory(*ppcVar15);
          __s2 = cmLocalGenerator::GetBinaryDirectory(*ppcVar15);
          iVar6 = strcmp(pcVar8,__s2);
          if (iVar6 == 0) goto LAB_003fbcfe;
        }
        std::__cxx11::string::~string((string *)&allFiles);
      }
      std::_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~_Vector_base
                (&targets.
                  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>);
    }
    std::operator<<((ostream *)&fout,"      </Build>\n");
    allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &allFiles._M_t._M_impl.super__Rb_tree_header._M_header;
    allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    allFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    cFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    cFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&srcExts,&((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->
                       CMakeInstance->SourceFileExtensions);
    for (ppcVar15 = (lgs->
                    super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                    _M_impl.super__Vector_impl_data._M_start;
        ppcVar15 !=
        (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
        super__Vector_impl_data._M_finish; ppcVar15 = ppcVar15 + 1) {
      pcVar1 = (*ppcVar15)->Makefile;
      std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
                ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&headerExts,
                 &(*ppcVar15)->GeneratorTargets);
      for (pbVar16 = headerExts.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pbVar16 !=
          headerExts.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; pbVar16 = (pointer)&pbVar16->_M_string_length)
      {
        TVar5 = cmGeneratorTarget::GetType((cmGeneratorTarget *)(pbVar16->_M_dataplus)._M_p);
        if (TVar5 < GLOBAL_TARGET) {
          sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pcVar2 = (cmGeneratorTarget *)(pbVar16->_M_dataplus)._M_p;
          std::__cxx11::string::string((string *)&targets,"CMAKE_BUILD_TYPE",&local_449);
          pcVar8 = cmMakefile::GetSafeDefinition
                             (pcVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&targets);
          std::__cxx11::string::string((string *)&fastTarget,pcVar8,&local_44a);
          cmGeneratorTarget::GetSourceFiles(pcVar2,&sources,&fastTarget);
          std::__cxx11::string::~string((string *)&fastTarget);
          std::__cxx11::string::~string((string *)&targets);
          for (ppcVar18 = sources.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start;
              ppcVar18 !=
              sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_finish; ppcVar18 = ppcVar18 + 1) {
            this_00 = *ppcVar18;
            std::__cxx11::string::string((string *)&fastTarget,"GENERATED",(allocator *)&targets);
            bVar3 = cmSourceFile::GetPropertyAsBool(this_00,&fastTarget);
            std::__cxx11::string::~string((string *)&fastTarget);
            if (!bVar3) {
              cmSourceFile::GetLanguage_abi_cxx11_(&fastTarget,*ppcVar18);
              bVar3 = std::operator==(&fastTarget,"C");
              if ((bVar3) || (bVar3 = std::operator==(&fastTarget,"CXX"), bVar3)) {
                psVar12 = cmSourceFile::GetExtension_abi_cxx11_(*ppcVar18);
                std::__cxx11::string::string((string *)&targets,(string *)psVar12);
                pbVar21 = srcExts.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                do {
                  bVar3 = pbVar21 !=
                          srcExts.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                  if (pbVar21 ==
                      srcExts.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) break;
                  _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&targets,pbVar21);
                  pbVar21 = pbVar21 + 1;
                } while (!_Var4);
                std::__cxx11::string::~string((string *)&targets);
              }
              else {
                bVar3 = false;
              }
              psVar12 = cmSourceFile::GetFullPath(*ppcVar18,(string *)0x0);
              std::__cxx11::string::string((string *)&targets,(string *)psVar12);
              if (bVar3) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&cFiles,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&targets);
              }
              pmVar13 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                        ::operator[](&allFiles,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&targets);
              std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
              push_back(&pmVar13->Targets,(value_type *)pbVar16);
              std::__cxx11::string::~string((string *)&targets);
              std::__cxx11::string::~string((string *)&fastTarget);
            }
          }
          std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
                    (&sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
        }
      }
      std::_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~_Vector_base
                ((_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)
                 &headerExts);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&headerExts,
             &((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->CMakeInstance->
              HeaderFileExtensions);
    for (pbVar16 = cFiles.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar16 !=
        cFiles.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pbVar16 = pbVar16 + 1) {
      cmsys::SystemTools::GetFilenamePath(&fastTarget,pbVar16);
      std::__cxx11::string::append((char *)&fastTarget);
      cmsys::SystemTools::GetFilenameWithoutExtension((string *)&targets,pbVar16);
      std::__cxx11::string::append((string *)&fastTarget);
      std::__cxx11::string::~string((string *)&targets);
      for (pbVar21 = headerExts.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pbVar21 !=
          headerExts.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; pbVar21 = pbVar21 + 1) {
        std::__cxx11::string::string((string *)&targets,(string *)&fastTarget);
        std::__cxx11::string::append((char *)&targets);
        std::__cxx11::string::append((string *)&targets);
        iVar14 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                 ::find(&allFiles._M_t,(string *)&targets);
        if ((_Rb_tree_header *)iVar14._M_node != &allFiles._M_t._M_impl.super__Rb_tree_header) {
LAB_003fc10d:
          std::__cxx11::string::~string((string *)&targets);
          break;
        }
        bVar3 = cmsys::SystemTools::FileExists
                          ((char *)targets.
                                   super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
        if (bVar3) {
          pmVar13 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                                  *)&allFiles._M_t,pbVar16);
          this_02 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                                  *)&allFiles._M_t,(string *)&targets);
          std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
          operator=(&this_02->Targets,&pmVar13->Targets);
          goto LAB_003fc10d;
        }
        std::__cxx11::string::~string((string *)&targets);
      }
      std::__cxx11::string::~string((string *)&fastTarget);
    }
    for (p_Var10 = allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var10 != &allFiles._M_t._M_impl.super__Rb_tree_header;
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
      poVar11 = std::operator<<((ostream *)&fout,"      <Unit filename=\"");
      cmXMLSafe::cmXMLSafe((cmXMLSafe *)&fastTarget,(string *)(p_Var10 + 1));
      poVar11 = operator<<(poVar11,(cmXMLSafe *)&fastTarget);
      std::operator<<(poVar11,"\">\n");
      for (p_Var20 = *(_Base_ptr *)(p_Var10 + 2); p_Var20 != p_Var10[2]._M_parent;
          p_Var20 = (_Base_ptr)&p_Var20->_M_parent) {
        psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(*(cmGeneratorTarget **)p_Var20);
        poVar11 = std::operator<<((ostream *)&fout,"         <Option target=\"");
        cmXMLSafe::cmXMLSafe((cmXMLSafe *)&fastTarget,psVar12);
        poVar11 = operator<<(poVar11,(cmXMLSafe *)&fastTarget);
        std::operator<<(poVar11,"\"/>\n");
      }
      std::operator<<((ostream *)&fout,"      </Unit>\n");
    }
    std::operator<<((ostream *)&fout,(string *)&unitFiles);
    std::operator<<((ostream *)&fout,"   </Project>\n</CodeBlocks_project_file>\n");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&headerExts);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&srcExts);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&cFiles);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
    ::~_Rb_tree(&allFiles._M_t);
    std::__cxx11::string::~string((string *)&make);
    std::__cxx11::string::~string((string *)&compiler);
    std::__cxx11::string::~string((string *)&unitFiles);
    std::__cxx11::string::~string((string *)&virtualFolders);
    Tree::~Tree(&tree);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
  return;
}

Assistant:

void cmExtraCodeBlocksGenerator
  ::CreateNewProjectFile(const std::vector<cmLocalGenerator*>& lgs,
                         const std::string& filename)
{
  const cmMakefile* mf=lgs[0]->GetMakefile();
  cmGeneratedFileStream fout(filename.c_str());
  if(!fout)
    {
    return;
    }

  Tree tree;

  // build tree of virtual folders
  for (std::map<std::string, std::vector<cmLocalGenerator*> >::const_iterator
          it = this->GlobalGenerator->GetProjectMap().begin();
         it != this->GlobalGenerator->GetProjectMap().end();
         ++it)
    {
    // Collect all files
    std::vector<std::string> listFiles;
    for (std::vector<cmLocalGenerator *>::const_iterator
         jt = it->second.begin();
         jt != it->second.end();
         ++jt)
      {
      const std::vector<std::string> & files =
                                          (*jt)->GetMakefile()->GetListFiles();
      listFiles.insert(listFiles.end(), files.begin(), files.end());
      }

    // Convert
    const char* cmakeRoot = mf->GetDefinition("CMAKE_ROOT");
    for (std::vector<std::string>::const_iterator jt = listFiles.begin();
         jt != listFiles.end();
         ++jt)
      {
      // don't put cmake's own files into the project (#12110):
      if (jt->find(cmakeRoot) == 0)
        {
        continue;
        }

      const std::string &relative = cmSystemTools::RelativePath(
                         it->second[0]->GetSourceDirectory(),
                         jt->c_str());
      std::vector<std::string> splitted;
      cmSystemTools::SplitPath(relative, splitted, false);
      // Split filename from path
      std::string fileName = *(splitted.end()-1);
      splitted.erase(splitted.end() - 1, splitted.end());

      // We don't want paths with CMakeFiles in them
      // or do we?
      // In speedcrunch those where purely internal
      if (splitted.size() >= 1
          && relative.find("CMakeFiles") == std::string::npos)
        {
        tree.InsertPath(splitted, 1, fileName);
        }
      }
    }

  // Now build a virtual tree string
  std::string virtualFolders;
  tree.BuildVirtualFolder(virtualFolders);
  // And one for <Unit>
  std::string unitFiles;
  tree.BuildUnit(unitFiles, std::string(lgs[0]->GetSourceDirectory()) + "/");

  // figure out the compiler
  std::string compiler = this->GetCBCompilerId(mf);
  std::string make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");

  fout<<"<?xml version=\"1.0\" encoding=\"UTF-8\" standalone=\"yes\" ?>\n"
        "<CodeBlocks_project_file>\n"
        "   <FileVersion major=\"1\" minor=\"6\" />\n"
        "   <Project>\n"
        "      <Option title=\"" << lgs[0]->GetProjectName()<<"\" />\n"
        "      <Option makefile_is_custom=\"1\" />\n"
        "      <Option compiler=\"" << compiler << "\" />\n"
        "      "<<virtualFolders<<"\n"
        "      <Build>\n";

  this->AppendTarget(fout, "all", 0, make.c_str(), lgs[0], compiler.c_str());

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (std::vector<cmLocalGenerator*>::const_iterator lg=lgs.begin();
       lg!=lgs.end(); lg++)
    {
    std::vector<cmGeneratorTarget*> targets=(*lg)->GetGeneratorTargets();
    for (std::vector<cmGeneratorTarget*>::iterator ti = targets.begin();
         ti != targets.end(); ti++)
      {
      std::string targetName = (*ti)->GetName();
      switch((*ti)->GetType())
        {
        case cmState::GLOBAL_TARGET:
          {
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (strcmp((*lg)->GetCurrentBinaryDirectory(),
                     (*lg)->GetBinaryDirectory())==0)
            {
            this->AppendTarget(fout, targetName, 0,
                               make.c_str(), *lg, compiler.c_str());
            }
          }
          break;
        case cmState::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if (((targetName.find("Nightly")==0)   &&(targetName!="Nightly"))
             || ((targetName.find("Continuous")==0)
                 &&(targetName!="Continuous"))
             || ((targetName.find("Experimental")==0)
                                             && (targetName!="Experimental")))
            {
            break;
            }

          this->AppendTarget(fout, targetName, 0,
                                 make.c_str(), *lg, compiler.c_str());
          break;
        case cmState::EXECUTABLE:
        case cmState::STATIC_LIBRARY:
        case cmState::SHARED_LIBRARY:
        case cmState::MODULE_LIBRARY:
        case cmState::OBJECT_LIBRARY:
          {
          cmGeneratorTarget* gt = *ti;
          this->AppendTarget(fout, targetName, gt,
                             make.c_str(), *lg, compiler.c_str());
          std::string fastTarget = targetName;
          fastTarget += "/fast";
          this->AppendTarget(fout, fastTarget, gt,
                             make.c_str(), *lg, compiler.c_str());
          }
          break;
        default:
          break;
        }
      }
    }

  fout<<"      </Build>\n";


  // Collect all used source files in the project.
  // Keep a list of C/C++ source files which might have an acompanying header
  // that should be looked for.
  typedef std::map<std::string, CbpUnit> all_files_map_t;
  all_files_map_t allFiles;
  std::vector<std::string> cFiles;

  std::vector<std::string> srcExts =
      this->GlobalGenerator->GetCMakeInstance()->GetSourceExtensions();

  for (std::vector<cmLocalGenerator*>::const_iterator lg=lgs.begin();
       lg!=lgs.end(); lg++)
    {
    cmMakefile* makefile=(*lg)->GetMakefile();
    std::vector<cmGeneratorTarget*> targets=(*lg)->GetGeneratorTargets();
    for (std::vector<cmGeneratorTarget*>::iterator ti = targets.begin();
         ti != targets.end(); ti++)
      {
      switch((*ti)->GetType())
        {
        case cmState::EXECUTABLE:
        case cmState::STATIC_LIBRARY:
        case cmState::SHARED_LIBRARY:
        case cmState::MODULE_LIBRARY:
        case cmState::OBJECT_LIBRARY:
        case cmState::UTILITY: // can have sources since 2.6.3
          {
          std::vector<cmSourceFile*> sources;
          cmGeneratorTarget* gt = *ti;
          gt->GetSourceFiles(sources,
                            makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
          for (std::vector<cmSourceFile*>::const_iterator si=sources.begin();
               si!=sources.end(); si++)
            {
            // don't add source files which have the GENERATED property set:
            if ((*si)->GetPropertyAsBool("GENERATED"))
              {
              continue;
              }

            // check whether it is a C/C++ implementation file
            bool isCFile = false;
            std::string lang = (*si)->GetLanguage();
            if (lang == "C" || lang == "CXX")
              {
              std::string srcext = (*si)->GetExtension();
              for(std::vector<std::string>::const_iterator
                  ext = srcExts.begin(); ext != srcExts.end(); ++ext)
                {
                if (srcext == *ext)
                  {
                  isCFile = true;
                  break;
                  }
                }
              }

            std::string fullPath = (*si)->GetFullPath();

            if(isCFile)
              {
              cFiles.push_back(fullPath);
              }

            CbpUnit &cbpUnit = allFiles[fullPath];
            cbpUnit.Targets.push_back(*ti);
            }
          }
        default:  // intended fallthrough
          break;
        }
      }
    }

  std::vector<std::string> headerExts =
      this->GlobalGenerator->GetCMakeInstance()->GetHeaderExtensions();

  // The following loop tries to add header files matching to implementation
  // files to the project. It does that by iterating over all
  // C/C++ source files,
  // replacing the file name extension with ".h" and checks whether such a
  // file exists. If it does, it is inserted into the map of files.
  // A very similar version of that code exists also in the kdevelop
  // project generator.
  for (std::vector<std::string>::const_iterator
       sit=cFiles.begin();
       sit!=cFiles.end();
       ++sit)
    {
    std::string const& fileName = *sit;
    std::string headerBasename=cmSystemTools::GetFilenamePath(fileName);
    headerBasename+="/";
    headerBasename+=cmSystemTools::GetFilenameWithoutExtension(fileName);

    // check if there's a matching header around
    for(std::vector<std::string>::const_iterator
        ext = headerExts.begin();
        ext != headerExts.end();
        ++ext)
      {
      std::string hname=headerBasename;
      hname += ".";
      hname += *ext;
      // if it's already in the set, don't check if it exists on disk
      if (allFiles.find(hname) != allFiles.end())
        {
        break;
        }

      if(cmSystemTools::FileExists(hname.c_str()))
        {
        allFiles[hname].Targets = allFiles[fileName].Targets;
        break;
        }
      }
    }

  // insert all source files in the CodeBlocks project
  for (all_files_map_t::const_iterator
       sit=allFiles.begin();
       sit!=allFiles.end();
       ++sit)
    {
    std::string const& unitFilename = sit->first;
    CbpUnit const& unit = sit->second;

    fout<<"      <Unit filename=\""<< cmXMLSafe(unitFilename) <<"\">\n";

    for(std::vector<const cmGeneratorTarget*>::const_iterator ti =
        unit.Targets.begin();
        ti != unit.Targets.end(); ++ti)
      {
      std::string const& targetName = (*ti)->GetName();
      fout<<"         <Option target=\""<< cmXMLSafe(targetName) <<"\"/>\n";
      }

    fout<<"      </Unit>\n";
    }

  // Add CMakeLists.txt
  fout<<unitFiles;

  fout<<"   </Project>\n"
        "</CodeBlocks_project_file>\n";
}